

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::JunitReporter::writeAssertion(JunitReporter *this,AssertionStats *stats)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  OfType OVar2;
  ostream *os;
  pointer pcVar3;
  pointer pMVar4;
  size_type sVar5;
  bool bVar6;
  uint uVar7;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar8;
  size_t sVar9;
  char *pcVar10;
  XmlWriter *this_00;
  MessageInfo *msg;
  pointer pMVar11;
  ReusableStringStream rss;
  string elementName;
  ScopedElement e;
  char local_c9;
  Column local_c8;
  string local_90;
  ReusableStringStream local_70;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  
  OVar2 = (stats->assertionResult).m_resultData.resultType;
  if ((OVar2 & FailureBit) == Ok) {
    return;
  }
  if (((stats->assertionResult).m_info.resultDisposition & SuppressFail) != 0) {
    return;
  }
  local_60 = &local_50;
  local_58 = 0;
  local_50 = 0;
  pcVar10 = "failure";
  if (OVar2 < Exception) {
    uVar7 = OVar2 + Info;
    if (0x13 < uVar7) goto LAB_0019cf86;
    if ((0x2000fU >> (uVar7 & 0x1f) & 1) == 0) {
      if ((0xc0000U >> (uVar7 & 0x1f) & 1) == 0) goto LAB_0019cf86;
    }
    else {
LAB_0019cf2b:
      pcVar10 = "internalError";
    }
  }
  else {
    if (OVar2 < DidntThrowException) {
      if (OVar2 == Exception) goto LAB_0019cf2b;
      if (OVar2 != ThrewException) goto LAB_0019cf86;
    }
    else {
      if (OVar2 == DidntThrowException) goto LAB_0019cf78;
      if (OVar2 != FatalErrorCondition) goto LAB_0019cf86;
    }
    pcVar10 = "error";
  }
LAB_0019cf78:
  std::__cxx11::string::_M_replace((ulong)&local_60,0,(char *)0x0,(ulong)pcVar10);
LAB_0019cf86:
  this_00 = &this->xml;
  XmlWriter::scopedElement
            ((XmlWriter *)&stack0xffffffffffffffc0,(string *)this_00,(XmlFormatting)&local_60);
  paVar1 = &local_c8.m_string.field_2;
  local_c8.m_string._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"message","");
  AssertionResult::getExpression_abi_cxx11_(&local_90,&stats->assertionResult);
  XmlWriter::writeAttribute(this_00,&local_c8.m_string,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.m_string._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8.m_string._M_dataplus._M_p,
                    local_c8.m_string.field_2._M_allocated_capacity + 1);
  }
  local_c8.m_string._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"type","");
  local_90._M_dataplus._M_p = (stats->assertionResult).m_info.macroName.m_start;
  local_90._M_string_length = (stats->assertionResult).m_info.macroName.m_size;
  XmlWriter::writeAttribute<Catch::StringRef>(this_00,&local_c8.m_string,(StringRef *)&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.m_string._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8.m_string._M_dataplus._M_p,
                    local_c8.m_string.field_2._M_allocated_capacity + 1);
  }
  pSVar8 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  sVar9 = StringStreams::add(&pSVar8->super_StringStreams);
  local_70.m_index = sVar9;
  pSVar8 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  os = (ostream *)
       (pSVar8->super_StringStreams).m_streams.
       super__Vector_base<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[sVar9].m_ptr;
  local_70.m_oss = os;
  if ((stats->totals).assertions.failed + (stats->totals).assertions.passed +
      (stats->totals).assertions.failedButOk == 0) {
    local_c8.m_string._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_c8,1);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(os,"FAILED",6);
    std::__ostream_insert<char,std::char_traits<char>>(os,":\n",2);
    if ((stats->assertionResult).m_info.capturedExpression.m_size != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"  ",2);
      AssertionResult::getExpressionInMacro_abi_cxx11_(&local_c8.m_string,&stats->assertionResult);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,local_c8.m_string._M_dataplus._M_p,local_c8.m_string._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.m_string._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8.m_string._M_dataplus._M_p,
                        local_c8.m_string.field_2._M_allocated_capacity + 1);
      }
      local_c8.m_string._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_c8,1);
    }
    bVar6 = AssertionResult::hasExpandedExpression(&stats->assertionResult);
    if (bVar6) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"with expansion:\n",0x10);
      AssertionResult::getExpandedExpression_abi_cxx11_(&local_90,&stats->assertionResult);
      local_c8.m_string._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,local_90._M_dataplus._M_p,
                 local_90._M_dataplus._M_p + local_90._M_string_length);
      local_c8.m_width = 0x4f;
      local_c8.m_initialIndent = 0xffffffffffffffff;
      local_c8.m_indent = 2;
      TextFlow::operator<<(os,&local_c8);
      local_c9 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_c9,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.m_string._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8.m_string._M_dataplus._M_p,
                        local_c8.m_string.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
  }
  pcVar3 = (stats->assertionResult).m_resultData.message._M_dataplus._M_p;
  local_c8.m_string._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar3,
             pcVar3 + (stats->assertionResult).m_resultData.message._M_string_length);
  sVar5 = local_c8.m_string._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.m_string._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8.m_string._M_dataplus._M_p,
                    local_c8.m_string.field_2._M_allocated_capacity + 1);
  }
  if (sVar5 != 0) {
    pcVar3 = (stats->assertionResult).m_resultData.message._M_dataplus._M_p;
    local_c8.m_string._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar3,
               pcVar3 + (stats->assertionResult).m_resultData.message._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,local_c8.m_string._M_dataplus._M_p,local_c8.m_string._M_string_length);
    local_90._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_90,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.m_string._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8.m_string._M_dataplus._M_p,
                      local_c8.m_string.field_2._M_allocated_capacity + 1);
    }
  }
  pMVar11 = (stats->infoMessages).
            super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
  pMVar4 = (stats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pMVar11 != pMVar4) {
    do {
      if (pMVar11->type == Info) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (os,(pMVar11->message)._M_dataplus._M_p,(pMVar11->message)._M_string_length);
        local_c8.m_string._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_c8,1);
      }
      pMVar11 = pMVar11 + 1;
    } while (pMVar11 != pMVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"at ",3);
  local_c8.m_string._M_dataplus._M_p = (stats->assertionResult).m_info.lineInfo.file;
  local_c8.m_string._M_string_length = (stats->assertionResult).m_info.lineInfo.line;
  operator<<(os,(SourceLineInfo *)&local_c8);
  std::__cxx11::stringbuf::str();
  XmlWriter::writeText(this_00,&local_c8.m_string,Newline);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.m_string._M_dataplus._M_p != &local_c8.m_string.field_2) {
    operator_delete(local_c8.m_string._M_dataplus._M_p,
                    local_c8.m_string.field_2._M_allocated_capacity + 1);
  }
  ReusableStringStream::~ReusableStringStream(&local_70);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&stack0xffffffffffffffc0);
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  return;
}

Assistant:

bool AssertionResult::isOk() const {
        return Catch::isOk(m_resultData.resultType) || shouldSuppressFailure(m_info.resultDisposition);
    }